

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O3

int __thiscall ev3dev::device::connect(device *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  _Rb_tree_node_base *p_Var1;
  bool bVar2;
  long lVar3;
  int iVar4;
  dirent *pdVar5;
  long *plVar6;
  const_iterator cVar7;
  _Rb_tree_node_base *p_Var8;
  undefined4 in_register_0000000c;
  size_type *psVar9;
  undefined4 in_register_00000034;
  bool bVar10;
  int iVar11;
  undefined8 unaff_R15;
  string strValue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_98;
  sockaddr *local_78;
  DIR *local_70;
  undefined1 *local_68;
  ulong local_60;
  undefined1 local_58 [16];
  long local_48;
  long *local_40;
  size_t local_38;
  
  local_40 = (long *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(size_t *)(__addr->sa_data + 6);
  local_70 = opendir((char *)*local_40);
  if (local_70 == (DIR *)0x0) {
    iVar11 = 0;
  }
  else {
    p_Var1 = (_Rb_tree_node_base *)(CONCAT44(in_register_0000000c,__len) + 8);
    local_78 = __addr;
    local_48 = CONCAT44(in_register_0000000c,__len);
    while( true ) {
      pdVar5 = readdir(local_70);
      unaff_R15 = CONCAT71((int7)((ulong)unaff_R15 >> 8),pdVar5 != (dirent *)0x0);
      iVar11 = (int)unaff_R15;
      if (pdVar5 == (dirent *)0x0) break;
      iVar4 = strncmp(pdVar5->d_name,*(char **)__addr,local_38);
      if (iVar4 == 0) {
        local_68 = local_58;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_68,*local_40,local_40[1] + *local_40);
        std::__cxx11::string::append((char *)&local_68);
        plVar6 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_68,local_60,0,'\x01');
        lVar3 = local_48;
        psVar9 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_98.field_2._M_allocated_capacity = *psVar9;
          local_98.field_2._8_8_ = plVar6[3];
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        }
        else {
          local_98.field_2._M_allocated_capacity = *psVar9;
          local_98._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_98._M_string_length = plVar6[1];
        *plVar6 = (long)psVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::operator=((string *)this,(string *)&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p);
        }
        if (local_68 != local_58) {
          operator_delete(local_68);
        }
        p_Var8 = *(_Rb_tree_node_base **)(lVar3 + 0x18);
        if (p_Var8 == p_Var1) break;
        bVar10 = true;
        do {
          get_attr_string(&local_98,this,(string *)(p_Var8 + 1));
          if (((p_Var8[3]._M_parent == (_Base_ptr)0x0) ||
              (p_Var8[2]._M_right[1]._M_parent == (_Base_ptr)0x0)) ||
             (cVar7 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)(p_Var8 + 2),&local_98),
             cVar7._M_node != (_Base_ptr)&p_Var8[2]._M_parent)) {
            bVar2 = true;
          }
          else {
            bVar10 = false;
            bVar2 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p);
          }
        } while ((bVar2) &&
                (p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8), p_Var8 != p_Var1));
        if (bVar10) break;
        (this->_path)._M_string_length = 0;
        *(this->_path)._M_dataplus._M_p = '\0';
        __addr = local_78;
      }
    }
    closedir(local_70);
  }
  return iVar11;
}

Assistant:

bool device::connect(
        const std::string &dir,
        const std::string &pattern,
        const std::map<std::string, std::set<std::string>> &match
        ) noexcept
{
    using namespace std;

    const size_t pattern_length = pattern.length();

    struct dirent *dp;
    DIR *dfd;

    if ((dfd = opendir(dir.c_str())) != nullptr) {
        while ((dp = readdir(dfd)) != nullptr) {
            if (strncmp(dp->d_name, pattern.c_str(), pattern_length)==0) {
                try {
                    _path = dir + dp->d_name + '/';

                    bool bMatch = true;
                    for (auto &m : match) {
                        const auto &attribute = m.first;
                        const auto &matches   = m.second;
                        const auto strValue   = get_attr_string(attribute);

                        if (!matches.empty() && !matches.begin()->empty() &&
                                (matches.find(strValue) == matches.end()))
                        {
                            bMatch = false;
                            break;
                        }
                    }

                    if (bMatch) {
                        closedir(dfd);
                        return true;
                    }
                } catch (...) { }

                _path.clear();
            }
        }

        closedir(dfd);
    }

    return false;
}